

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::CloseUnrolledLoop
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  uint32_t uVar2;
  BasicBlock *pBVar3;
  Instruction *pIVar4;
  mapped_type *pmVar5;
  reference ppBVar6;
  reference this_00;
  pointer basic_block;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *this_01;
  reference ppIVar7;
  Instruction *last_phi;
  iterator __end2_3;
  iterator __begin2_3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_3;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *block_itr;
  iterator __end2_2;
  iterator __begin2_2;
  BasicBlockListTy *__range2_2;
  BasicBlock *block;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2_1;
  Instruction *pIStack_a0;
  uint32_t initalizer_id;
  Instruction *induction;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  SmallVector<unsigned_int,_2UL> local_50;
  Instruction *local_28;
  Instruction *latch_instruction;
  Instruction *merge_inst;
  Loop *loop_local;
  LoopUnrollerUtilsImpl *this_local;
  
  merge_inst = (Instruction *)loop;
  loop_local = (Loop *)this;
  pBVar3 = Loop::GetHeaderBlock(loop);
  latch_instruction = BasicBlock::GetLoopMergeInst(pBVar3);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_back(&this->invalidated_instructions_,&latch_instruction);
  pIVar4 = BasicBlock::terminator((this->state_).previous_latch_block_);
  local_28 = pIVar4;
  pBVar3 = Loop::GetMergeBlock((Loop *)merge_inst);
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = BasicBlock::id(pBVar3);
  init_list._M_len = 1;
  init_list._M_array =
       (iterator)
       ((long)&inductions.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
  opt::Instruction::SetInOperand(pIVar4,0,&local_50);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
  IRContext::UpdateDefUse(this->context_,local_28);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  Loop::GetInductionVariables
            ((Loop *)merge_inst,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&(this->state_).new_inst);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
  induction = (Instruction *)
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&induction);
    if (!bVar1) break;
    ppIVar7 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    pIVar4 = *ppIVar7;
    pIStack_a0 = pIVar4;
    pBVar3 = Loop::GetPreHeaderBlock((Loop *)merge_inst);
    uVar2 = BasicBlock::id(pBVar3);
    uVar2 = GetPhiDefID(this,pIVar4,uVar2);
    __range2_1._4_4_ = uVar2;
    __range2_1._0_4_ = opt::Instruction::result_id(pIStack_a0);
    pmVar5 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&(this->state_).new_inst,(key_type *)&__range2_1);
    *pmVar5 = uVar2;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ::begin(&this->loop_blocks_inorder_);
  block = (BasicBlock *)
          std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
          end(&this->loop_blocks_inorder_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                        *)&block);
    if (!bVar1) break;
    ppBVar6 = __gnu_cxx::
              __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
              ::operator*(&__end2_1);
    RemapOperands(this,*ppBVar6);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ::begin(&this->blocks_to_add_);
  block_itr = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)std::
                 vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ::end(&this->blocks_to_add_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                        *)&block_itr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
              ::operator*(&__end2_2);
    basic_block = std::
                  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ::get(this_00);
    RemapOperands(this,basic_block);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
    ::operator++(&__end2_2);
  }
  this_01 = &(this->state_).previous_phis_;
  __end2_3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(this_01);
  last_phi = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                        *)&last_phi);
    if (!bVar1) break;
    ppIVar7 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2_3);
    RemapOperands(this,*ppIVar7);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_3);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::CloseUnrolledLoop(Loop* loop) {
  // Remove the OpLoopMerge instruction from the function.
  Instruction* merge_inst = loop->GetHeaderBlock()->GetLoopMergeInst();
  invalidated_instructions_.push_back(merge_inst);

  // Remove the final backedge to the header and make it point instead to the
  // merge block.
  Instruction* latch_instruction = state_.previous_latch_block_->terminator();
  latch_instruction->SetInOperand(0, {loop->GetMergeBlock()->id()});
  context_->UpdateDefUse(latch_instruction);

  // Remove all induction variables as the phis will now be invalid. Replace all
  // uses with the constant initializer value (all uses of phis will be in
  // the first iteration with the subsequent phis already having been removed).
  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);

  // We can use the state instruction mechanism to replace all internal loop
  // values within the first loop trip (as the subsequent ones will be updated
  // by the copy function) with the value coming in from the preheader and then
  // use context ReplaceAllUsesWith for the uses outside the loop with the final
  // trip phi value.
  state_.new_inst.clear();
  for (Instruction* induction : inductions) {
    uint32_t initalizer_id =
        GetPhiDefID(induction, loop->GetPreHeaderBlock()->id());

    state_.new_inst[induction->result_id()] = initalizer_id;
  }

  for (BasicBlock* block : loop_blocks_inorder_) {
    RemapOperands(block);
  }
  for (auto& block_itr : blocks_to_add_) {
    RemapOperands(block_itr.get());
  }

  // Rewrite the last phis, since they may still reference the original phi.
  for (Instruction* last_phi : state_.previous_phis_) {
    RemapOperands(last_phi);
  }
}